

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void * fio_defer_cycle(void *ignr)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  timespec local_30;
  
LAB_00135e73:
  fio_defer_perform();
  if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
    return ignr;
  }
  local_30.tv_sec = *(ulong *)(in_FS_OFFSET + -0x300) / 1000000000;
  local_30.tv_nsec = *(ulong *)(in_FS_OFFSET + -0x300) % 1000000000;
  nanosleep(&local_30,(timespec *)0x0);
  iVar1 = fio_defer_has_queue();
  lVar2 = 1;
  if (iVar1 == 0) goto code_r0x00135eb8;
  goto LAB_00135ecd;
code_r0x00135eb8:
  if (*(ulong *)(in_FS_OFFSET + -0x300) < 0x7ffff00) {
    lVar2 = *(ulong *)(in_FS_OFFSET + -0x300) * 2;
LAB_00135ecd:
    *(long *)(in_FS_OFFSET + -0x300) = lVar2;
  }
  goto LAB_00135e73;
}

Assistant:

static void *fio_defer_cycle(void *ignr) {
  fio_defer_on_thread_start();
  for (;;) {
    fio_defer_perform();
    if (!fio_is_running())
      break;
    fio_defer_thread_wait();
  }
  fio_defer_on_thread_end();
  return ignr;
}